

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReSolve
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  int *piVar1;
  undefined1 *puVar2;
  pointer psVar3;
  sp_counted_base *psVar4;
  BGIP_BnB_NodePtr *pBVar5;
  char cVar6;
  ostream *poVar7;
  long lVar8;
  Index i;
  ulong uVar9;
  int iVar10;
  double dVar11;
  Interface_ProblemToPolicyDiscretePure *local_a8;
  shared_count sStack_a0;
  long local_98 [2];
  BGIP_BnB_NodePtr local_88;
  BGIP_BnB_NodePtr local_78;
  undefined1 *local_60;
  BGIP_BnB_NodePtr local_58;
  BGIP_BnB_NodePtr local_48;
  
  if (0 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "BGIP_SolverBranchAndBound starting BG Branch\'n\'Bound search now!",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    lVar8 = *(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                      super_BGIP_IncrementalSolverInterface.field_0x10;
    local_a8 = *(Interface_ProblemToPolicyDiscretePure **)
                &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                 super_BGIP_IncrementalSolverInterface.field_0x8;
    sStack_a0.pi_ =
         *(sp_counted_base **)
          &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
           super_BGIP_IncrementalSolverInterface.field_0x10;
    if (lVar8 != 0) {
      LOCK();
      piVar1 = (int *)(lVar8 + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies(local_a8,TYPE_INDEX,999999);
    boost::detail::shared_count::~shared_count(&sStack_a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Solver Address: ",0x2a);
    poVar7 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", nr BG JPols=",0xe);
    poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", CBG_LB=",9);
    poVar7 = std::ostream::_M_insert<double>(this->_m_CBGlowerBound);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  this->_m_maxLowerBound = -1.79769313486232e+308;
  puVar2 = &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
            super_BGIP_IncrementalSolverInterface.field_0x18;
  lVar8 = BGIPSolution::GetNrFoundSolutions();
  if (lVar8 != 0) {
    dVar11 = (double)BGIPSolution::GetPayoff();
    this->_m_maxLowerBound = dVar11;
    if (0 < this->_m_verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Initialized max lower bound to value of best solution (out of ",0x3e);
      BGIPSolution::GetNrFoundSolutions();
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," already found): ",0x11);
      poVar7 = std::ostream::_M_insert<double>(this->_m_maxLowerBound);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  local_60 = puVar2;
  if ((this->_m_openQueue->c).
      super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->_m_openQueue->c).
      super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    i = 0;
    iVar10 = -1;
    uVar9 = 1;
    do {
      PrintStatistics(this,i);
      if ((int)(uVar9 / 100) * 100 + iVar10 == 0) {
        local_a8 = (Interface_ProblemToPolicyDiscretePure *)local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"BnB deadline exceeded","");
        (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>
                               ).super_BGIP_IncrementalSolverInterface + 8))(this,&local_a8);
        if (local_a8 != (Interface_ProblemToPolicyDiscretePure *)local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
      }
      psVar3 = (this->_m_openQueue->c).
               super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = (psVar3->pn).pi_;
      local_a8 = (Interface_ProblemToPolicyDiscretePure *)psVar3->px;
      sStack_a0.pi_ = (psVar3->pn).pi_;
      if (psVar4 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar4->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      if (((*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                      super_BGIP_IncrementalSolverInterface.field_0x30 == 1) &&
          (cVar6 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)local_a8), cVar6 != '\0')) &&
         (this->_m_CBGupperBound + -1e-12 <
          *(double *)(local_a8 + 0x10) + *(double *)(local_a8 + 0x18))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Hit CBG upperbound",0x12);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        local_48.px = (element_type *)local_a8;
        local_48.pn.pi_ = sStack_a0.pi_;
        if (sStack_a0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (sStack_a0.pi_)->use_count_ = (sStack_a0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        pBVar5 = &local_48;
        ProcessFullySpecifiedNode(this,&local_48);
LAB_00120d59:
        boost::detail::shared_count::~shared_count(&pBVar5->pn);
        this->_m_nrNodesFullySpecified = this->_m_nrNodesFullySpecified + 1;
        boost::detail::shared_count::~shared_count(&sStack_a0);
        break;
      }
      if ((*(double *)(local_a8 + 0x10) + *(double *)(local_a8 + 0x18) < this->_m_maxLowerBound) &&
         (cVar6 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)local_a8), cVar6 != '\0')) {
        local_58.px = (element_type *)local_a8;
        local_58.pn.pi_ = sStack_a0.pi_;
        if (sStack_a0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (sStack_a0.pi_)->use_count_ = (sStack_a0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        pBVar5 = &local_58;
        ProcessFullySpecifiedNode(this,&local_58);
        goto LAB_00120d59;
      }
      cVar6 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)local_a8);
      if (cVar6 == '\0') {
        if (3 < this->_m_verbosity) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"BGIP_SolverBranchAndBound EXPANDING top node ",0x2d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
        }
        local_88.px = (element_type *)local_a8;
        local_88.pn.pi_ = sStack_a0.pi_;
        if (sStack_a0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (sStack_a0.pi_)->use_count_ = (sStack_a0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        ExpandAllExtensions(this,&local_88);
        boost::detail::shared_count::~shared_count(&local_88.pn);
      }
      else {
        local_78.px = (element_type *)local_a8;
        local_78.pn.pi_ = sStack_a0.pi_;
        if (sStack_a0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (sStack_a0.pi_)->use_count_ = (sStack_a0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        ProcessFullySpecifiedNode(this,&local_78);
        boost::detail::shared_count::~shared_count(&local_78.pn);
        this->_m_nrNodesFullySpecified = this->_m_nrNodesFullySpecified + 1;
      }
      boost::detail::shared_count::~shared_count(&sStack_a0);
      iVar10 = iVar10 + -1;
      uVar9 = (ulong)((int)uVar9 + 1);
      i = i + 1;
    } while ((this->_m_openQueue->c).
             super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->_m_openQueue->c).
             super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (0 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Found ",0x20);
    BGIPSolution::GetNrFoundSolutions();
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," solutions, after expanding ",0x1c);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," nodes (",8);
    dVar11 = GetPerJPRatio(this,this->_m_nrNodesExpanded);
    poVar7 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," pjp) - of which ",0x11);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," full (",7);
    dVar11 = GetPerJPRatio(this,this->_m_nrNodesFullySpecified);
    poVar7 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," pjp) - and pruning ",0x14);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," of those",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound ",0x1a);
    poVar7 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Open Queue size: ",0x12);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  dVar11 = (double)BGIPSolution::GetPayoff();
  return dVar11;
}

Assistant:

double ReSolve()
    {
        if(_m_verbosity>=1)
        {
            std::cout << "BGIP_SolverBranchAndBound starting BG Branch'n'Bound search now!"<<std::endl;
            LIndex nrJPols=0;
            try{
                nrJPols = this->GetBGIPI()->GetNrJointPolicies();
            } catch(E& e)
            { ; }
            std::cout << "BGIP_SolverBranchAndBound Solver Address: "
                      << this << ", nr BG JPols=" << nrJPols
                      << ", CBG_LB=" << _m_CBGlowerBound << std::endl;
        }

        _m_maxLowerBound=-DBL_MAX;
#if INITIALIZE_LB_TO_BESTFOUND
        if(this->GetNrFoundSolutions()>0)
        {
            _m_maxLowerBound=this->GetPayoff();
            if(_m_verbosity>=1)
                std::cout << "Initialized max lower bound to value of best solution (out of "
                          << this->GetNrFoundSolutions() << " already found): "
                          << _m_maxLowerBound << std::endl;
        }
#endif

        Index i=0;
        // keep on expanding the open queue until it's empty
        while(!_m_openQueue->empty())
        {
            PrintStatistics(i++);

            if(i % 100 == 0)
                this->CheckDeadline("BnB deadline exceeded");

            BGIP_BnB_NodePtr top=_m_openQueue->top();
            

            if(this->GetNrDesiredSolutions()==1 &&
               top->IsFullySpecifiedPolicy(_m_maxDepth) &&
               top->GetF() > (_m_CBGupperBound-PROB_PRECISION))
            {
                std::cout << "Hit CBG upperbound" << std::endl;
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
                break;
            }
#if BAILOUT_WHEN_CBG_LOWERBOUND_IS_HIT
            if(top->GetF() < _m_CBGlowerBound)
            {
                std::cout << "Hit CBG lowerbound, bailing out" << std::endl;
                return(-DBL_MAX);
            }
#endif
            if(top->GetF() < _m_maxLowerBound &&
               top->IsFullySpecifiedPolicy(_m_maxDepth)) // we still need to check
                                              // whether this is a fully
                                              // specified policy, there
                                              // can be multiple nodes
                                              // with the same
                                              // heuristic<LB, but not all
                                              // need to be complete
            {
                //We are done!!!
                //(max. upper bound < best found policy)
                
                //put the best policy on the solution
    //             ConvertNodeToPolicyAndAddToSolution(top, _m_maxLowerBound);
    //             PopAndDeleteNode(top);
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
                //not really needed:
                //Prune(_m_maxLowerBound);
                break;
            }

            //for evaluation of the final policy, the expansion of nodes
            //and the computation of heuristic values  for the children we
            //will need to check whether actions are consistent. 
#if CACHE_IMPLIED_JPOL
            //(We cache the already specified actions in _m_impliedJPol)
            InitImpliedJPol();
#if DEBUG_VALID_ACTIONS 
            std::cout << "BGIP_SolverBranchAndBound implied jpol after initialization: " << 
                SoftPrintVector(_m_impliedJPol) << std::endl;
#endif                        
            top->GetImpliedJPol(_m_bgip, _m_jtIndexMapping, _m_impliedJPol);
#if DEBUG_VALID_ACTIONS 
            std::cout << "BGIP_SolverBranchAndBound implied jpol after GetImpliedJPol: " << 
                SoftPrintVector(_m_impliedJPol) << std::endl;
#endif                        
#endif // CACHE_IMPLIED_JPOL

            //else (if ! top->GetF() < _m_maxLowerBound )
            // check if node is fully specified
            if(top->IsFullySpecifiedPolicy(_m_maxDepth))
            {
                // updates _m_maxLowerBound and deletes the node
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
            }
            else
            {
                if(_m_verbosity>3)
                    std::cout << "BGIP_SolverBranchAndBound EXPANDING top node "
                              <<std::endl;
                //top will be expanded
                //
#if INCR_EXPAND
                if(_m_expandAll)
                    ExpandAllExtensions(top);
                else
                    ExpandOneExtension(top);
#else                    
                ExpandAllExtensions(top);
#endif
            }
        }

        if(_m_verbosity>=1)
        {
            std::cout << "BGIP_SolverBranchAndBound Found "
                      << (this->
                          GetNrFoundSolutions())
                      << " solutions, after expanding "
                      << _m_nrNodesExpanded << " nodes ("
                      << GetPerJPRatio(_m_nrNodesExpanded) <<" pjp) - of which "
                      << _m_nrNodesFullySpecified << " full ("
                      << GetPerJPRatio(_m_nrNodesFullySpecified)
                      << " pjp) - and pruning "
                      << _m_nrNodesPruned << " of those"
                      << std::endl;
            std::cout << "BGIP_SolverBranchAndBound " << this
                      << " Open Queue size: " << _m_openQueue->size() << std::endl;
        }

        return(this->
               GetPayoff());
    }